

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedTypeSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NameSyntax&>
          (BumpAllocator *this,NameSyntax *args)

{
  NamedTypeSyntax *pNVar1;
  
  pNVar1 = (NamedTypeSyntax *)allocate(this,0x20,8);
  (pNVar1->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = NamedType;
  (pNVar1->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar1->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pNVar1->name).ptr = args;
  (args->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pNVar1;
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }